

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void dr_prediction_z1_32xN_avx2
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 *puVar11;
  long in_RCX;
  long in_RDX;
  long lVar12;
  long in_RSI;
  int in_EDI;
  uint in_R9D;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int i_1;
  __m256i dstvec [64];
  int mdiff;
  int jj;
  int j;
  __m256i shift;
  int i;
  int base_max_diff;
  int base;
  __m128i a1_128;
  __m128i a0_128;
  __m256i res16 [2];
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m256i c3f;
  __m256i diff;
  __m256i a_mbase_x;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int local_f04;
  undefined8 local_f00 [264];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 *local_698;
  int local_68c;
  int local_688;
  int local_684;
  undefined1 local_680 [32];
  int local_64c;
  int local_648;
  int local_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620 [4];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  int local_588;
  uint local_584;
  undefined1 local_580 [16];
  undefined1 auStack_570 [16];
  undefined1 local_560 [32];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  int local_488;
  undefined4 local_484;
  uint local_480;
  long local_478;
  undefined8 *local_470;
  int local_464;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  ushort local_3c8;
  undefined2 local_3c6;
  undefined2 local_3c4;
  byte local_3c1;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined1 local_380 [16];
  undefined1 auStack_370 [16];
  undefined2 local_360;
  undefined2 local_35e;
  undefined2 local_35c;
  undefined2 local_35a;
  undefined2 local_358;
  undefined2 local_356;
  undefined2 local_354;
  undefined2 local_352;
  undefined2 local_350;
  undefined2 local_34e;
  undefined2 local_34c;
  undefined2 local_34a;
  undefined2 local_348;
  undefined2 local_346;
  undefined2 local_344;
  undefined2 local_342;
  undefined1 local_340 [32];
  undefined2 local_320;
  undefined2 local_31e;
  undefined2 local_31c;
  undefined2 local_31a;
  undefined2 local_318;
  undefined2 local_316;
  undefined2 local_314;
  undefined2 local_312;
  undefined2 local_310;
  undefined2 local_30e;
  undefined2 local_30c;
  undefined2 local_30a;
  undefined2 local_308;
  undefined2 local_306;
  undefined2 local_304;
  undefined2 local_302;
  undefined1 local_300 [32];
  ushort local_2e0;
  ushort local_2de;
  ushort local_2dc;
  ushort local_2da;
  ushort local_2d8;
  ushort local_2d6;
  ushort local_2d4;
  ushort local_2d2;
  ushort local_2d0;
  ushort local_2ce;
  ushort local_2cc;
  ushort local_2ca;
  ushort local_2c8;
  ushort local_2c6;
  ushort local_2c4;
  ushort local_2c2;
  undefined1 local_2c0 [16];
  undefined1 auStack_2b0 [16];
  byte local_2a0;
  byte local_29f;
  byte local_29e;
  byte local_29d;
  byte local_29c;
  byte local_29b;
  byte local_29a;
  byte local_299;
  byte local_298;
  byte local_297;
  byte local_296;
  byte local_295;
  byte local_294;
  byte local_293;
  byte local_292;
  byte local_291;
  byte local_290;
  byte local_28f;
  byte local_28e;
  byte local_28d;
  byte local_28c;
  byte local_28b;
  byte local_28a;
  byte local_289;
  byte local_288;
  byte local_287;
  byte local_286;
  byte local_285;
  byte local_284;
  byte local_283;
  byte local_282;
  byte local_281;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  undefined1 (*local_1b8) [16];
  undefined1 (*local_1b0) [16];
  undefined4 local_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined4 local_164;
  undefined1 local_160 [32];
  undefined4 local_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [16];
  undefined1 auStack_90 [16];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_470 = local_f00;
  local_484 = 6;
  local_488 = in_EDI + 0x1f;
  local_3c4 = 0x10;
  local_342 = 0x10;
  local_344 = 0x10;
  local_346 = 0x10;
  local_348 = 0x10;
  local_34a = 0x10;
  local_34c = 0x10;
  local_34e = 0x10;
  local_350 = 0x10;
  local_352 = 0x10;
  local_354 = 0x10;
  local_356 = 0x10;
  local_358 = 0x10;
  local_35a = 0x10;
  local_35c = 0x10;
  local_35e = 0x10;
  local_360 = 0x10;
  auVar13._16_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x10,2);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x10,3);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x10,4);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x10,5);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x10,6);
  local_380 = vpinsrw_avx(auVar13._16_16_,0x10,7);
  auVar13._16_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x10,2);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x10,3);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x10,4);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x10,5);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x10,6);
  auStack_370 = vpinsrw_avx(auVar13._16_16_,0x10,7);
  local_520 = local_380._0_8_;
  uStack_518 = local_380._8_8_;
  uStack_510 = auStack_370._0_8_;
  uStack_508 = auStack_370._8_8_;
  local_3c1 = *(byte *)(in_RCX + (in_EDI + 0x1f));
  local_281 = local_3c1;
  local_282 = local_3c1;
  local_283 = local_3c1;
  local_284 = local_3c1;
  local_285 = local_3c1;
  local_286 = local_3c1;
  local_287 = local_3c1;
  local_288 = local_3c1;
  local_289 = local_3c1;
  local_28a = local_3c1;
  local_28b = local_3c1;
  local_28c = local_3c1;
  local_28d = local_3c1;
  local_28e = local_3c1;
  local_28f = local_3c1;
  local_290 = local_3c1;
  local_291 = local_3c1;
  local_292 = local_3c1;
  local_293 = local_3c1;
  local_294 = local_3c1;
  local_295 = local_3c1;
  local_296 = local_3c1;
  local_297 = local_3c1;
  local_298 = local_3c1;
  local_299 = local_3c1;
  local_29a = local_3c1;
  local_29b = local_3c1;
  local_29c = local_3c1;
  local_29d = local_3c1;
  local_29e = local_3c1;
  local_29f = local_3c1;
  local_2a0 = local_3c1;
  auVar13._16_16_ = vpinsrb_avx(ZEXT116(local_3c1),(uint)local_3c1,1);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,2);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,3);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,4);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,5);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,6);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,7);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,8);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,9);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,10);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,0xb);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,0xc);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,0xd);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,0xe);
  local_2c0 = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,0xf);
  auVar13._16_16_ = vpinsrb_avx(ZEXT116(local_3c1),(uint)local_3c1,1);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,2);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,3);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,4);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,5);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,6);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,7);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,8);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,9);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,10);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,0xb);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,0xc);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,0xd);
  auVar13._16_16_ = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,0xe);
  auStack_2b0 = vpinsrb_avx(auVar13._16_16_,(uint)local_3c1,0xf);
  local_540 = local_2c0._0_8_;
  uStack_538 = local_2c0._8_8_;
  uStack_530 = auStack_2b0._0_8_;
  uStack_528 = auStack_2b0._8_8_;
  local_3c6 = 0x3f;
  local_302 = 0x3f;
  local_304 = 0x3f;
  local_306 = 0x3f;
  local_308 = 0x3f;
  local_30a = 0x3f;
  local_30c = 0x3f;
  local_30e = 0x3f;
  local_310 = 0x3f;
  local_312 = 0x3f;
  local_314 = 0x3f;
  local_316 = 0x3f;
  local_318 = 0x3f;
  local_31a = 0x3f;
  local_31c = 0x3f;
  local_31e = 0x3f;
  local_320 = 0x3f;
  auVar13._16_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x3f,2);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x3f,3);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x3f,4);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x3f,5);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x3f,6);
  auVar13._16_16_ = vpinsrw_avx(auVar13._16_16_,0x3f,7);
  auVar13._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
  auVar13._0_16_ = vpinsrw_avx(auVar13._0_16_,0x3f,2);
  auVar13._0_16_ = vpinsrw_avx(auVar13._0_16_,0x3f,3);
  auVar13._0_16_ = vpinsrw_avx(auVar13._0_16_,0x3f,4);
  auVar13._0_16_ = vpinsrw_avx(auVar13._0_16_,0x3f,5);
  auVar13._0_16_ = vpinsrw_avx(auVar13._0_16_,0x3f,6);
  auVar13._0_16_ = vpinsrw_avx(auVar13._0_16_,0x3f,7);
  auVar13._0_16_ = ZEXT116(0) * auVar13._16_16_ + ZEXT116(1) * auVar13._0_16_;
  auVar13._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13._16_16_;
  local_340 = auVar13;
  local_580 = auVar13._0_16_;
  auStack_570 = auVar13._16_16_;
  local_588 = 0;
  local_584 = in_R9D;
  local_480 = in_R9D;
  local_478 = in_RCX;
  local_464 = in_EDI;
  while( true ) {
    auStack_570._8_8_ = auVar13._24_8_;
    auStack_570._0_8_ = auVar13._16_8_;
    if (local_464 <= local_588) goto LAB_005c1b23;
    local_644 = (int)local_584 >> 6;
    local_648 = local_488 - local_644;
    if (local_648 < 1) break;
    if (0x20 < local_648) {
      local_648 = 0x20;
    }
    local_3c8 = (ushort)local_584;
    local_2c2 = (ushort)local_584;
    local_2c4 = (ushort)local_584;
    local_2c6 = (ushort)local_584;
    local_2c8 = (ushort)local_584;
    local_2ca = (ushort)local_584;
    local_2cc = (ushort)local_584;
    local_2ce = (ushort)local_584;
    local_2d0 = (ushort)local_584;
    local_2d2 = (ushort)local_584;
    local_2d4 = (ushort)local_584;
    local_2d6 = (ushort)local_584;
    local_2d8 = (ushort)local_584;
    local_2da = (ushort)local_584;
    local_2dc = (ushort)local_584;
    local_2de = (ushort)local_584;
    local_2e0 = (ushort)local_584;
    auVar1 = vpinsrw_avx(ZEXT216((ushort)local_584),local_584 & 0xffff,1);
    auVar1 = vpinsrw_avx(auVar1,local_584 & 0xffff,2);
    auVar1 = vpinsrw_avx(auVar1,local_584 & 0xffff,3);
    auVar1 = vpinsrw_avx(auVar1,local_584 & 0xffff,4);
    auVar1 = vpinsrw_avx(auVar1,local_584 & 0xffff,5);
    auVar1 = vpinsrw_avx(auVar1,local_584 & 0xffff,6);
    auVar1 = vpinsrw_avx(auVar1,local_584 & 0xffff,7);
    auVar2 = vpinsrw_avx(ZEXT216((ushort)local_584),local_584 & 0xffff,1);
    auVar2 = vpinsrw_avx(auVar2,local_584 & 0xffff,2);
    auVar2 = vpinsrw_avx(auVar2,local_584 & 0xffff,3);
    auVar2 = vpinsrw_avx(auVar2,local_584 & 0xffff,4);
    auVar2 = vpinsrw_avx(auVar2,local_584 & 0xffff,5);
    auVar2 = vpinsrw_avx(auVar2,local_584 & 0xffff,6);
    auVar2 = vpinsrw_avx(auVar2,local_584 & 0xffff,7);
    local_300._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    local_300._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    local_1e0 = local_300._0_16_;
    auStack_1d0 = local_300._16_16_;
    local_200 = auVar13._0_16_;
    auStack_1f0 = auVar13._16_16_;
    auVar5._16_8_ = local_300._16_8_;
    auVar5._0_16_ = local_300._0_16_;
    auVar5._24_8_ = local_300._24_8_;
    auVar3._16_8_ = auStack_570._0_8_;
    auVar3._0_16_ = auVar13._0_16_;
    auVar3._24_8_ = auStack_570._8_8_;
    local_160 = vpand_avx2(auVar5,auVar3);
    local_164 = 1;
    local_680 = vpsrlw_avx2(local_160,ZEXT416(1));
    local_688 = 0;
    for (local_684 = 0; uVar10 = uStack_528, uVar9 = uStack_530, uVar8 = uStack_538,
        local_684 < 0x20; local_684 = local_684 + 0x10) {
      local_68c = local_648 - local_684;
      local_580 = auVar13._0_16_;
      auStack_570 = auVar13._16_16_;
      if (local_648 - local_684 < 1) {
        lVar12 = (long)local_688;
        local_620[lVar12 * 4] = local_540;
        local_620[lVar12 * 4 + 1] = uVar8;
        local_620[lVar12 * 4 + 2] = uVar9;
        *(undefined8 *)(local_600 + lVar12 * 0x20 + -8) = uVar10;
        auVar13._0_16_ = local_580;
        auVar13._16_16_ = auStack_570;
      }
      else {
        local_1b0 = (undefined1 (*) [16])(local_478 + local_644 + (long)local_684);
        local_630 = *(undefined8 *)*local_1b0;
        uStack_628 = *(undefined8 *)(*local_1b0 + 8);
        local_1b8 = (undefined1 (*) [16])((long)local_684 + 1 + local_478 + local_644);
        local_640 = *(undefined8 *)*local_1b8;
        uStack_638 = *(undefined8 *)(*local_1b8 + 8);
        local_40 = *(undefined8 *)*local_1b0;
        uStack_38 = *(undefined8 *)(*local_1b0 + 8);
        local_4c0 = vpmovzxbw_avx2(*local_1b0);
        local_50 = *(undefined8 *)*local_1b8;
        uStack_48 = *(undefined8 *)(*local_1b8 + 8);
        local_4e0 = vpmovzxbw_avx2(*local_1b8);
        local_220 = local_4e0._0_8_;
        uStack_218 = local_4e0._8_8_;
        uStack_210 = local_4e0._16_8_;
        uStack_208 = local_4e0._24_8_;
        local_240 = local_4c0._0_8_;
        uStack_238 = local_4c0._8_8_;
        uStack_230 = local_4c0._16_8_;
        uStack_228 = local_4c0._24_8_;
        local_560 = vpsubw_avx2(local_4e0,local_4c0);
        local_120 = local_4c0._0_8_;
        uStack_118 = local_4c0._8_8_;
        uStack_110 = local_4c0._16_8_;
        uStack_108 = local_4c0._24_8_;
        local_124 = 5;
        auVar13 = vpsllw_avx2(local_4c0,ZEXT416(5));
        local_500._0_8_ = auVar13._0_8_;
        local_500._8_8_ = auVar13._8_8_;
        local_500._16_8_ = auVar13._16_8_;
        local_500._24_8_ = auVar13._24_8_;
        local_400 = local_500._0_8_;
        uStack_3f8 = local_500._8_8_;
        uStack_3f0 = local_500._16_8_;
        uStack_3e8 = local_500._24_8_;
        local_420 = local_520;
        uStack_418 = uStack_518;
        uStack_410 = uStack_510;
        uStack_408 = uStack_508;
        auVar4._8_8_ = uStack_518;
        auVar4._0_8_ = local_520;
        auVar4._16_8_ = uStack_510;
        auVar4._24_8_ = uStack_508;
        local_500 = vpaddw_avx2(auVar13,auVar4);
        local_e0 = local_560._0_8_;
        uStack_d8 = local_560._8_8_;
        uStack_d0 = local_560._16_8_;
        uStack_c8 = local_560._24_8_;
        local_100 = local_680._0_8_;
        uStack_f8 = local_680._8_8_;
        uStack_f0 = local_680._16_8_;
        uStack_e8 = local_680._24_8_;
        local_5c0 = vpmullw_avx2(local_560,local_680);
        local_440 = local_500._0_8_;
        uStack_438 = local_500._8_8_;
        uStack_430 = local_500._16_8_;
        uStack_428 = local_500._24_8_;
        local_460 = local_5c0._0_8_;
        uStack_458 = local_5c0._8_8_;
        uStack_450 = local_5c0._16_8_;
        uStack_448 = local_5c0._24_8_;
        auVar13 = vpaddw_avx2(local_500,local_5c0);
        local_5e0._0_8_ = auVar13._0_8_;
        local_5e0._8_8_ = auVar13._8_8_;
        local_5e0._16_8_ = auVar13._16_8_;
        local_5e0._24_8_ = auVar13._24_8_;
        local_1a0 = local_5e0._0_8_;
        uStack_198 = local_5e0._8_8_;
        uStack_190 = local_5e0._16_8_;
        uStack_188 = local_5e0._24_8_;
        local_1a4 = 5;
        local_5e0 = vpsrlw_avx2(auVar13,ZEXT416(5));
        local_390 = local_5e0._16_8_;
        uStack_388 = local_5e0._24_8_;
        local_260 = local_5e0._0_8_;
        uStack_258 = local_5e0._8_8_;
        uStack_250 = local_5e0._16_8_;
        uStack_248 = local_5e0._24_8_;
        local_280 = ZEXT1632(local_5e0._16_16_);
        auVar13 = vpackuswb_avx2(local_5e0,ZEXT1632(local_5e0._16_16_));
        *(undefined1 (*) [32])(local_620 + (long)local_688 * 4) = auVar13;
        auVar13._0_16_ = local_580;
        auVar13._16_16_ = auStack_570;
      }
      local_688 = local_688 + 1;
    }
    local_3c0 = local_600._0_8_;
    uStack_3b8 = local_600._8_8_;
    uStack_3b0 = local_600._16_8_;
    uStack_3a8 = local_600._24_8_;
    auVar14._0_16_ = ZEXT116(0) * local_600._0_16_ + ZEXT116(1) * local_620._0_16_;
    auVar14._16_16_ = ZEXT116(0) * local_620._16_16_ + ZEXT116(1) * local_600._0_16_;
    local_600 = auVar14;
    auVar5 = local_600;
    local_600._16_8_ = auVar14._16_8_;
    local_600._24_8_ = auVar14._24_8_;
    lVar12 = (long)local_648;
    local_80 = local_540;
    uStack_78 = uStack_538;
    uStack_70 = uStack_530;
    uStack_68 = uStack_528;
    local_a0 = auVar14._0_16_;
    auStack_90 = auVar14._16_16_;
    local_c0 = *(undefined8 *)BaseMask[lVar12];
    uStack_b8 = *(undefined8 *)(BaseMask[lVar12] + 8);
    uStack_b0 = *(undefined8 *)(BaseMask[lVar12] + 0x10);
    uStack_a8 = *(undefined8 *)(BaseMask[lVar12] + 0x18);
    auVar7._8_8_ = uStack_538;
    auVar7._0_8_ = local_540;
    auVar7._16_8_ = uStack_530;
    auVar7._24_8_ = uStack_528;
    auVar6._16_8_ = local_600._16_8_;
    auVar6._0_16_ = auVar14._0_16_;
    auVar6._24_8_ = local_600._24_8_;
    auVar3 = vpblendvb_avx2(auVar7,auVar6,(undefined1  [32])BaseMask[lVar12]);
    *(undefined1 (*) [32])(local_470 + (long)local_588 * 4) = auVar3;
    local_584 = local_480 + local_584;
    local_588 = local_588 + 1;
    local_600 = auVar5;
  }
  for (local_64c = local_588; local_64c < local_464; local_64c = local_64c + 1) {
    puVar11 = local_470 + (long)local_64c * 4;
    *puVar11 = local_540;
    puVar11[1] = uStack_538;
    puVar11[2] = uStack_530;
    puVar11[3] = uStack_528;
  }
LAB_005c1b23:
  for (local_f04 = 0; local_f04 < in_EDI; local_f04 = local_f04 + 1) {
    local_698 = (undefined8 *)(in_RSI + in_RDX * local_f04);
    lVar12 = (long)local_f04;
    uStack_6b8 = local_f00[lVar12 * 4 + 1];
    uStack_6b0 = local_f00[lVar12 * 4 + 2];
    uStack_6a8 = local_f00[lVar12 * 4 + 3];
    local_6c0 = local_f00[lVar12 * 4];
    *local_698 = local_f00[lVar12 * 4];
    local_698[1] = uStack_6b8;
    local_698[2] = uStack_6b0;
    local_698[3] = uStack_6a8;
  }
  return;
}

Assistant:

static void dr_prediction_z1_32xN_avx2(int N, uint8_t *dst, ptrdiff_t stride,
                                       const uint8_t *above, int upsample_above,
                                       int dx) {
  __m256i dstvec[64];
  dr_prediction_z1_32xN_internal_avx2(N, dstvec, above, upsample_above, dx);
  for (int i = 0; i < N; i++) {
    _mm256_storeu_si256((__m256i *)(dst + stride * i), dstvec[i]);
  }
}